

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.h
# Opt level: O0

void PrintVersion(void)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,3);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"b2eb09046af4bc17497a8555bdbf6c67da639aa7");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintVersion()
{
    // to be overwritten by CMakeLists.txt
    std::cout << MAJOR << '.' << MINOR << '.' << PATCH << '.' << REVISION << " " << COMMIT << std::endl;
}